

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Determinant<2>::doExpand
          (Determinant<2> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Matrix<float,_2,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<tcu::Vector<float,_2>_> local_e8;
  ExprP<float> local_d8;
  ExprP<tcu::Vector<float,_2>_> local_c8;
  ExprP<float> local_b8;
  ExprP<float> local_a8;
  ExprP<tcu::Vector<float,_2>_> local_98;
  ExprP<float> local_88 [2];
  ExprP<tcu::Vector<float,_2>_> local_68;
  ExprP<float> local_58;
  ExprP<float> local_48;
  undefined1 local_38 [8];
  ExprP<tcu::Matrix<float,_2,_2>_> mat;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Determinant<2> *this_local;
  
  ExprP<tcu::Matrix<float,_2,_2>_>::ExprP((ExprP<tcu::Matrix<float,_2,_2>_> *)local_38,in_RCX);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_68,
             (int)(ExprP<tcu::Matrix<float,_2,_2>_> *)local_38);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_58,(int)&local_68);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_98,(int)local_38);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)local_88,(int)&local_98);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_48,&local_58,local_88);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_c8,(int)local_38);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_b8,(int)&local_c8);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_e8,(int)local_38);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_d8,(int)&local_e8);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_a8,&local_b8,&local_d8);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)this,&local_48,&local_a8);
  ExprP<float>::~ExprP(&local_a8);
  ExprP<float>::~ExprP(&local_d8);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_e8);
  ExprP<float>::~ExprP(&local_b8);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_c8);
  ExprP<float>::~ExprP(&local_48);
  ExprP<float>::~ExprP(local_88);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_98);
  ExprP<float>::~ExprP(&local_58);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_68);
  ExprP<tcu::Matrix<float,_2,_2>_>::~ExprP((ExprP<tcu::Matrix<float,_2,_2>_> *)local_38);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand (ExpandContext&, const ArgExprs& args)	const
	{
		ExprP<Mat2>	mat	= args.a;

		return mat[0][0] * mat[1][1] - mat[1][0] * mat[0][1];
	}